

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::Runner::runTestsForGroup
          (Totals *__return_storage_ptr__,Runner *this,RunContext *context,
          TestCaseFilters *filterGroup)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *pvVar4;
  undefined4 extraout_var_00;
  reference pTVar5;
  IStreamingReporter *pIVar6;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> pVar7;
  byte local_109;
  undefined1 local_c0 [40];
  undefined1 local_98 [80];
  _Self local_48;
  _Self local_40;
  int local_34;
  const_iterator cStack_30;
  int testsRunForGroup;
  const_iterator itEnd;
  const_iterator it;
  TestCaseFilters *filterGroup_local;
  RunContext *context_local;
  Runner *this_local;
  
  Totals::Totals(__return_storage_ptr__);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])();
  pvVar4 = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))();
  itEnd = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(pvVar4);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])();
  pvVar4 = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
           (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))();
  cStack_30 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(pvVar4);
  local_34 = 0;
  while (bVar1 = __gnu_cxx::operator!=(&itEnd,&stack0xffffffffffffffd0), bVar1) {
    pTVar5 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator*(&itEnd);
    bVar1 = TestCaseFilters::shouldInclude(filterGroup,pTVar5);
    if (bVar1) {
      local_34 = local_34 + 1;
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&itEnd);
      local_40._M_node =
           (_Base_ptr)
           std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
           find(&this->m_testsAlreadyRun,pTVar5);
      local_48._M_node =
           (_Base_ptr)
           std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
           end(&this->m_testsAlreadyRun);
      bVar1 = std::operator==(&local_40,&local_48);
      if (bVar1) {
        bVar1 = RunContext::aborting(context);
        if (bVar1) break;
        pTVar5 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                 ::operator*(&itEnd);
        RunContext::runTest((Totals *)(local_98 + 0x30),context,pTVar5);
        Totals::operator+=(__return_storage_ptr__,(Totals *)(local_98 + 0x30));
        pTVar5 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                 ::operator*(&itEnd);
        pVar7 = std::
                set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
                insert(&this->m_testsAlreadyRun,pTVar5);
        local_98._32_8_ = pVar7.first._M_node;
        local_98[0x28] = pVar7.second;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&itEnd);
  }
  local_c0[0x27] = 0;
  local_109 = 0;
  if (local_34 == 0) {
    TestCaseFilters::getName_abi_cxx11_((TestCaseFilters *)local_98);
    local_c0[0x27] = 1;
    local_109 = std::__cxx11::string::empty();
    local_109 = local_109 ^ 0xff;
  }
  if ((local_c0[0x27] & 1) != 0) {
    std::__cxx11::string::~string((string *)local_98);
  }
  if ((local_109 & 1) != 0) {
    pIVar6 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
    TestCaseFilters::getName_abi_cxx11_((TestCaseFilters *)local_c0);
    (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[5])
              (pIVar6,(TestCaseFilters *)local_c0);
    std::__cxx11::string::~string((string *)local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTestsForGroup( RunContext& context, const TestCaseFilters& filterGroup ) {
            Totals totals;
            std::vector<TestCase>::const_iterator it = getRegistryHub().getTestCaseRegistry().getAllTests().begin();
            std::vector<TestCase>::const_iterator itEnd = getRegistryHub().getTestCaseRegistry().getAllTests().end();
            int testsRunForGroup = 0;
            for(; it != itEnd; ++it ) {
                if( filterGroup.shouldInclude( *it ) ) {
                    testsRunForGroup++;
                    if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                        if( context.aborting() )
                            break;

                        totals += context.runTest( *it );
                        m_testsAlreadyRun.insert( *it );
                    }
                }
            }
            if( testsRunForGroup == 0 && !filterGroup.getName().empty() )
                m_reporter->noMatchingTestCases( filterGroup.getName() );
            return totals;

        }